

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascr.c
# Opt level: O3

void ascr_shift_one_cache_frame(ascr_t *a,int32 win_efv)

{
  int32 *piVar1;
  int32 *piVar2;
  int32 *piVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  
  if (1 < win_efv) {
    piVar1 = a->cache_best_list;
    uVar4 = 0;
    do {
      uVar5 = uVar4 + 1;
      piVar1[uVar4] = piVar1[uVar4 + 1];
      if (0 < a->n_cisen) {
        piVar2 = a->cache_ci_senscr[uVar5];
        piVar3 = a->cache_ci_senscr[uVar4];
        lVar6 = 0;
        do {
          piVar3[lVar6] = piVar2[lVar6];
          lVar6 = lVar6 + 1;
        } while (lVar6 < a->n_cisen);
      }
      uVar4 = uVar5;
    } while (uVar5 != win_efv - 1);
  }
  return;
}

Assistant:

void
ascr_shift_one_cache_frame(ascr_t * a, int32 win_efv)
{
    int32 i, j;
    for (i = 0; i < win_efv - 1; i++) {
        a->cache_best_list[i] = a->cache_best_list[i + 1];
        for (j = 0; j < a->n_cisen; j++) {
            a->cache_ci_senscr[i][j] = a->cache_ci_senscr[i + 1][j];
        }
    }
}